

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ESOINN.h
# Opt level: O2

void __thiscall
soinn::ESOINN::serialize<boost::archive::xml_iarchive>(ESOINN *this,xml_iarchive *ar,uint version)

{
  nvp<boost::adjacency_list<boost::listS,_boost::listS,_boost::undirectedS,_boost::property<boost::vertex_index_t,_unsigned_long,_soinn::VertexProperties>,_soinn::EdgeProperties,_boost::no_property,_boost::listS>_>
  local_28;
  
  local_28.n_ = "dim";
  local_28.v_ = (adjacency_list<boost::listS,_boost::listS,_boost::undirectedS,_boost::property<boost::vertex_index_t,_unsigned_long,_soinn::VertexProperties>,_soinn::EdgeProperties,_boost::no_property,_boost::listS>
                 *)this;
  boost::archive::basic_xml_iarchive<boost::archive::xml_iarchive>::load_override<int>
            ((basic_xml_iarchive<boost::archive::xml_iarchive> *)ar,(nvp<int> *)&local_28);
  local_28.v_ = (adjacency_list<boost::listS,_boost::listS,_boost::undirectedS,_boost::property<boost::vertex_index_t,_unsigned_long,_soinn::VertexProperties>,_soinn::EdgeProperties,_boost::no_property,_boost::listS>
                 *)&this->ageMax;
  local_28.n_ = "ageMax";
  boost::archive::basic_xml_iarchive<boost::archive::xml_iarchive>::load_override<int>
            ((basic_xml_iarchive<boost::archive::xml_iarchive> *)ar,(nvp<int> *)&local_28);
  local_28.v_ = (adjacency_list<boost::listS,_boost::listS,_boost::undirectedS,_boost::property<boost::vertex_index_t,_unsigned_long,_soinn::VertexProperties>,_soinn::EdgeProperties,_boost::no_property,_boost::listS>
                 *)&this->iterationCount;
  local_28.n_ = "iterationCount";
  boost::archive::basic_xml_iarchive<boost::archive::xml_iarchive>::load_override<int>
            ((basic_xml_iarchive<boost::archive::xml_iarchive> *)ar,(nvp<int> *)&local_28);
  local_28.v_ = (adjacency_list<boost::listS,_boost::listS,_boost::undirectedS,_boost::property<boost::vertex_index_t,_unsigned_long,_soinn::VertexProperties>,_soinn::EdgeProperties,_boost::no_property,_boost::listS>
                 *)&this->iterationThreshold;
  local_28.n_ = "iterationThreshold";
  boost::archive::basic_xml_iarchive<boost::archive::xml_iarchive>::load_override<int>
            ((basic_xml_iarchive<boost::archive::xml_iarchive> *)ar,(nvp<int> *)&local_28);
  local_28.v_ = (adjacency_list<boost::listS,_boost::listS,_boost::undirectedS,_boost::property<boost::vertex_index_t,_unsigned_long,_soinn::VertexProperties>,_soinn::EdgeProperties,_boost::no_property,_boost::listS>
                 *)&this->numberOfClasses;
  local_28.n_ = "numberOfClasses";
  boost::archive::basic_xml_iarchive<boost::archive::xml_iarchive>::load_override<int>
            ((basic_xml_iarchive<boost::archive::xml_iarchive> *)ar,(nvp<int> *)&local_28);
  local_28.v_ = (adjacency_list<boost::listS,_boost::listS,_boost::undirectedS,_boost::property<boost::vertex_index_t,_unsigned_long,_soinn::VertexProperties>,_soinn::EdgeProperties,_boost::no_property,_boost::listS>
                 *)&this->c1;
  local_28.n_ = "c1";
  boost::archive::basic_xml_iarchive<boost::archive::xml_iarchive>::load_override<double>
            ((basic_xml_iarchive<boost::archive::xml_iarchive> *)ar,(nvp<double> *)&local_28);
  local_28.v_ = (adjacency_list<boost::listS,_boost::listS,_boost::undirectedS,_boost::property<boost::vertex_index_t,_unsigned_long,_soinn::VertexProperties>,_soinn::EdgeProperties,_boost::no_property,_boost::listS>
                 *)&this->c2;
  local_28.n_ = "c2";
  boost::archive::basic_xml_iarchive<boost::archive::xml_iarchive>::load_override<double>
            ((basic_xml_iarchive<boost::archive::xml_iarchive> *)ar,(nvp<double> *)&local_28);
  local_28.v_ = &this->graph;
  local_28.n_ = "graph";
  boost::archive::basic_xml_iarchive<boost::archive::xml_iarchive>::
  load_override<boost::adjacency_list<boost::listS,boost::listS,boost::undirectedS,boost::property<boost::vertex_index_t,unsigned_long,soinn::VertexProperties>,soinn::EdgeProperties,boost::no_property,boost::listS>>
            ((basic_xml_iarchive<boost::archive::xml_iarchive> *)ar,&local_28);
  return;
}

Assistant:

void serialize(Archive & ar, const unsigned int version) {
        ar & BOOST_SERIALIZATION_NVP(dim);
        ar & BOOST_SERIALIZATION_NVP(ageMax);
        ar & BOOST_SERIALIZATION_NVP(iterationCount);
        ar & BOOST_SERIALIZATION_NVP(iterationThreshold);
        ar & BOOST_SERIALIZATION_NVP(numberOfClasses);
        ar & BOOST_SERIALIZATION_NVP(c1);
        ar & BOOST_SERIALIZATION_NVP(c2);
        ar & BOOST_SERIALIZATION_NVP(graph);
    }